

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O2

void speech_prog_elven_mirror(OBJ_DATA *obj,CHAR_DATA *ch,char *speech)

{
  ROOM_INDEX_DATA *pRoomIndex;
  ROOM_INDEX_DATA *pRoomIndex_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  CHAR_DATA *arg2_00;
  char *pcVar4;
  char *pcVar5;
  char arg4 [4608];
  char buf [4608];
  char arg3 [4608];
  char arg2 [4608];
  char arg1 [4608];
  
  pRoomIndex = ch->in_room;
  bVar1 = is_worn(obj);
  if (bVar1) {
    half_chop(speech,arg1,arg2);
    half_chop(arg2,arg3,arg4);
    bVar1 = str_prefix(arg1,"show");
    if (((!bVar1) && (arg4[0] != '\0')) &&
       (arg2_00 = get_char_world(ch,arg4), arg2_00 != (CHAR_DATA *)0x0)) {
      pRoomIndex_00 = arg2_00->in_room;
      act("$p begins to change colour as it attempts to find $N.",ch,obj,arg2_00,0);
      uVar2 = *(int *)&pRoomIndex_00->sector_type - 1;
      if ((ushort)uVar2 < 0x14) {
        pcVar5 = &DAT_003f09d4 + *(int *)(&DAT_003f09d4 + (ulong)(uVar2 & 0xffff) * 4);
      }
      else {
        pcVar5 = "but cannot make out their surroundings";
      }
      pcVar5 = talloc_string(pcVar5);
      iVar3 = number_percent();
      if (iVar3 == 1) {
        act("$p suddenly stabilizes into a perfect image of $N!",ch,obj,arg2_00,3);
        char_from_room(ch);
        char_to_room(ch,pRoomIndex_00);
        do_look(ch,"auto");
        char_from_room(ch);
        char_to_room(ch,pRoomIndex);
        WAIT_STATE(ch,0x18);
        free_pstring(obj->description);
        pcVar5 = arg2_00->name;
        pcVar4 = get_room_name(pRoomIndex_00);
        sprintf(buf,
                "A curious mirror lies here, humming softly.  Peering into the glass, you see %s standing in %s."
                ,pcVar5,pcVar4);
      }
      else {
        if (0x57 < iVar3 - 2U) {
          if (iVar3 < 0x5a) {
            return;
          }
          act("$p fails to form into a coherent image.",ch,obj,(void *)0x0,3);
          return;
        }
        act("$p forms into a hazy image of $N.",ch,obj,arg2_00,3);
        sprintf(buf,"Peering into the mirror, you see $N %s.",pcVar5);
        act(buf,ch,(void *)0x0,arg2_00,3);
        free_pstring(obj->description);
        sprintf(buf,
                "A curious mirror lies here, humming softly.  Peering into the glass, you see %s %s."
                ,arg2_00->name,pcVar5);
      }
      pcVar5 = palloc_string(buf);
      obj->description = pcVar5;
    }
  }
  return;
}

Assistant:

void speech_prog_elven_mirror(OBJ_DATA *obj, CHAR_DATA *ch, char *speech)
{
	char arg1[MSL], arg2[MSL], arg3[MSL], arg4[MSL], buf[MSL];
	CHAR_DATA *victim;
	char *sect;
	ROOM_INDEX_DATA *room, *room2 = ch->in_room;
	int rand;

	if (!is_worn(obj))
		return;

	half_chop(speech, arg1, arg2);
	half_chop(arg2, arg3, arg4);

	if (str_prefix(arg1, "show"))
		return;

	if (!arg4[0] || !(victim = get_char_world(ch, arg4)))
		return;

	room = victim->in_room;
	act("$p begins to change colour as it attempts to find $N.", ch, obj, victim, TO_ROOM);

	switch (room->sector_type)
	{
		case SECT_INSIDE:
			sect = talloc_string("inside a room");
			break;
		case SECT_CITY:
			sect = talloc_string("in a city");
			break;
		case SECT_FOREST:
			sect = talloc_string("in a forest");
			break;
		case SECT_MOUNTAIN:
			sect = talloc_string("in the mountains");
			break;
		case SECT_FIELD:
			sect = talloc_string("in a field");
			break;
		case SECT_HILLS:
			sect = talloc_string("among some hills");
			break;
		case SECT_WATER:
			sect = talloc_string("on a body of water");
			break;
		case SECT_UNDERWATER:
			sect = talloc_string("underwater");
			break;
		case SECT_AIR:
			sect = talloc_string("in mid-air");
			break;
		case SECT_CONFLAGRATION:
			sect = talloc_string("amidst a raging fire");
			break;
		case SECT_BURNING:
			sect = talloc_string("amidst a raging fire");
			break;
		case SECT_DESERT:
			sect = talloc_string("in a parched desert");
			break;
		case SECT_ROAD:
			sect = talloc_string("on a road");
			break;
		case SECT_TRAIL:
			sect = talloc_string("along a trail");
			break;
		case SECT_SWAMP:
			sect = talloc_string("in a swamp");
			break;
		case SECT_PARK:
			sect = talloc_string("in a park");
			break;
		case SECT_VERTICAL:
			sect = talloc_string("near some cliffs");
			break;
		case SECT_ICE:
			sect = talloc_string("amidst snow and ice");
			break;
		case SECT_SNOW:
			sect = talloc_string("amidst snow and ice");
			break;
		case SECT_CAVE:
			sect = talloc_string("in a cave");
			break;
		default:
			sect = talloc_string("but cannot make out their surroundings");
			break;
	}

	rand = number_percent();

	if (rand == 1)
	{
		act("$p suddenly stabilizes into a perfect image of $N!", ch, obj, victim, TO_CHAR);

		char_from_room(ch);
		char_to_room(ch, room);
		do_look(ch, "auto");
		char_from_room(ch);
		char_to_room(ch, room2);

		WAIT_STATE(ch, PULSE_VIOLENCE * 2);

		free_pstring(obj->description);
		sprintf(buf, "A curious mirror lies here, humming softly.  Peering into the glass, you see %s standing in %s.",
			victim->name,
			get_room_name(room));

		obj->description = palloc_string(buf);
		return;
	}

	if (rand > 1 && rand < 90)
	{
		act("$p forms into a hazy image of $N.", ch, obj, victim, TO_CHAR);
		sprintf(buf, "Peering into the mirror, you see $N %s.", sect);
		act(buf, ch, 0, victim, TO_CHAR);

		free_pstring(obj->description);
		sprintf(buf, "A curious mirror lies here, humming softly.  Peering into the glass, you see %s %s.", victim->name, sect);
		obj->description = palloc_string(buf);
		return;
	}

	if (rand > 89)
		act("$p fails to form into a coherent image.", ch, obj, 0, TO_CHAR);
}